

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O3

Instr * __thiscall
Peeps::PeepCondMove(Peeps *this,LabelInstr *labelInstr,Instr *nextInstr,bool isInHelper)

{
  char cVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  uint uVar5;
  LabelInstr *pLVar6;
  undefined4 *puVar7;
  LabelInstr *this_00;
  Instr *pIVar8;
  OpCode OVar9;
  
  pLVar6 = labelInstr;
  while( true ) {
    pLVar6 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pLVar6->super_Instr);
    OVar9 = (pLVar6->super_Instr).m_opcode;
    if (OVar9 != MOV) break;
    OVar3 = IR::Opnd::GetKind((pLVar6->super_Instr).m_src1);
    if (OVar3 != OpndKindReg) {
      return nextInstr;
    }
    OVar3 = IR::Opnd::GetKind((pLVar6->super_Instr).m_dst);
    if (OVar3 != OpndKindReg) {
      return nextInstr;
    }
  }
  if ((pLVar6->super_Instr).m_kind == InstrKindBranch) {
    if (OVar9 < ADD) {
      if (OVar9 == Br) {
        return nextInstr;
      }
      if (OVar9 == MultiBr) {
        return nextInstr;
      }
    }
    else {
      bVar4 = LowererMD::IsUnconditionalBranch((Instr *)pLVar6);
      if (bVar4) {
        return nextInstr;
      }
    }
    if ((pLVar6->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar4) goto LAB_0061cd24;
      *puVar7 = 0;
    }
    cVar1 = *(char *)((long)&(pLVar6->labelRefs).
                             super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                             super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                             super_SListNodeBase<Memory::ArenaAllocator>.next + 1);
    if ((pLVar6->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
        allocator == (Type)0x0) {
      if (cVar1 != '\0') {
        return nextInstr;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
      if (bVar4) {
        *puVar7 = 0;
        return nextInstr;
      }
LAB_0061cd24:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    if (cVar1 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
      if (!bVar4) goto LAB_0061cd24;
      *puVar7 = 0;
    }
    if ((pLVar6->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar4) goto LAB_0061cd24;
      *puVar7 = 0;
    }
    if (((LabelInstr *)
         (pLVar6->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         allocator == labelInstr) && ((pLVar6->super_Instr).m_opcode != Leave)) {
      this_00 = (LabelInstr *)IR::Instr::AsBranchInstr((Instr *)pLVar6);
      uVar5 = *(int *)&(this_00->super_Instr).m_opcode - 0x41d;
      pLVar6 = this_00;
      if (((ushort)uVar5 < 0x11) && ((0x1fdffU >> (uVar5 & 0x1f) & 1) != 0)) {
        OVar9 = *(OpCode *)(&DAT_010548e0 + (ulong)(uVar5 & 0xffff) * 2);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                           ,0x4dd,"((0))","UNREACHED");
        if (!bVar4) goto LAB_0061cd24;
        *puVar7 = 0;
        OVar9 = InvalidOpCode;
      }
      while (pLVar6 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&pLVar6->super_Instr),
            pLVar6 != labelInstr) {
        (pLVar6->super_Instr).m_opcode = OVar9;
      }
      IR::Instr::Remove((Instr *)this_00);
      if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
           (labelInstr->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
           .super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next == &labelInstr->labelRefs) &&
         ((labelInstr->field_0x78 & 4) == 0)) {
        pIVar8 = PeepUnreachableLabel(labelInstr,isInHelper,(bool *)0x0);
        return pIVar8;
      }
    }
  }
  return nextInstr;
}

Assistant:

IR::Instr*
Peeps::PeepCondMove(IR::LabelInstr *labelInstr, IR::Instr *nextInstr, const bool isInHelper)
{
    IR::Instr *instr = labelInstr->GetPrevRealInstrOrLabel();

    Js::OpCode newOpCode = Js::OpCode::InvalidOpCode;

    // Check if BB is all MOVs with both RegOpnd
    while(instr->m_opcode == Js::OpCode::MOV)
    {
        if (!instr->GetSrc1()->IsRegOpnd() || !instr->GetDst()->IsRegOpnd())
            return nextInstr;
        instr = instr->GetPrevRealInstrOrLabel();
    }

    // Did we hit a conditional branch ?
    if (instr->IsBranchInstr() && instr->AsBranchInstr()->IsConditional() &&
        !instr->AsBranchInstr()->IsMultiBranch() &&
        instr->AsBranchInstr()->GetTarget() == labelInstr &&
        instr->m_opcode != Js::OpCode::Leave)
    {
        IR::BranchInstr *brInstr = instr->AsBranchInstr();

        // Get the correct CMOVcc
        switch(brInstr->m_opcode)
        {
        case Js::OpCode::JA:
                newOpCode = Js::OpCode::CMOVBE;
                break;
        case Js::OpCode::JAE:
                newOpCode = Js::OpCode::CMOVB;
                break;
        case Js::OpCode::JB:
                newOpCode = Js::OpCode::CMOVAE;
                break;
        case Js::OpCode::JBE:
                newOpCode = Js::OpCode::CMOVA;
                break;
        case Js::OpCode::JEQ:
                newOpCode = Js::OpCode::CMOVNE;
                break;
        case Js::OpCode::JNE:
                newOpCode = Js::OpCode::CMOVE;
                break;
        case Js::OpCode::JNP:
                newOpCode = Js::OpCode::CMOVP;
                break;
        case Js::OpCode::JLT:
                newOpCode = Js::OpCode::CMOVGE;
                break;
        case Js::OpCode::JLE:
                newOpCode = Js::OpCode::CMOVG;
                break;
        case Js::OpCode::JGT:
                newOpCode = Js::OpCode::CMOVLE;
                break;
        case Js::OpCode::JGE:
                newOpCode = Js::OpCode::CMOVL;
                break;
        case Js::OpCode::JNO:
                newOpCode = Js::OpCode::CMOVO;
                break;
        case Js::OpCode::JO:
                newOpCode = Js::OpCode::CMOVNO;
                break;
        case Js::OpCode::JP:
                newOpCode = Js::OpCode::CMOVNP;
                break;
        case Js::OpCode::JNSB:
                newOpCode = Js::OpCode::CMOVS;
                break;
        case Js::OpCode::JSB:
                newOpCode = Js::OpCode::CMOVNS;
                break;
        default:
                Assert(UNREACHED);
                __assume(UNREACHED);
        }

        // convert the entire block to CMOVs
        instr = brInstr->GetNextRealInstrOrLabel();
        while(instr != labelInstr)
        {
            instr->m_opcode = newOpCode;
            instr = instr->GetNextRealInstrOrLabel();
        }

        // remove the Jcc
        brInstr->Remove();
        // We may have exposed an unreachable label by deleting the branch
        if (labelInstr->IsUnreferenced())
           return Peeps::PeepUnreachableLabel(labelInstr, isInHelper);
    }
    return nextInstr;
}